

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::PerformDefaultAction<bool(unsigned_short)>
          (FunctionMocker<bool_(unsigned_short)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  Result_conflict1 RVar1;
  ActionResultHolder<bool> *pAVar2;
  
  pAVar2 = (ActionResultHolder<bool> *)operator_new(0x10);
  RVar1 = FunctionMocker<bool_(unsigned_short)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002adc18;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }